

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O3

void __thiscall mjs::throw_statement::print(throw_statement *this,wostream *os)

{
  expression *peVar1;
  
  std::operator<<(os,"throw_statement{");
  peVar1 = (this->e_)._M_t.
           super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>._M_t.
           super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
           super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl;
  if (peVar1 != (expression *)0x0) {
    (**(code **)((long)(peVar1->super_syntax_node)._vptr_syntax_node + 0x10))(peVar1,os);
  }
  std::operator<<(os,"}");
  return;
}

Assistant:

void print(std::wostream& os) const override {
        os << "throw_statement{";
        if (e_) os << *e_;
        os << "}";
    }